

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

void wasm::Path::setBinaryenBinDir(string *dir)

{
  std::__cxx11::string::_M_assign((string *)&binDir_abi_cxx11_);
  if ((DAT_010d2508 != 0) && (*(char *)(binDir_abi_cxx11_ + -1 + DAT_010d2508) == '/')) {
    return;
  }
  std::__cxx11::string::push_back('\0');
  return;
}

Assistant:

void setBinaryenBinDir(const std::string& dir) {
  binDir = dir;
  if (binDir.empty() || binDir.back() != getPathSeparator()) {
    binDir += getPathSeparator();
  }
}